

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::Clog2Function::Clog2Function(Clog2Function *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,Clog2,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005a4958;
  return;
}

Assistant:

Clog2Function() : SystemSubroutine(KnownSystemName::Clog2, SubroutineKind::Function) {}